

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor *
ggml_view_4d(ggml_context *ctx,ggml_tensor *a,int64_t ne0,int64_t ne1,int64_t ne2,int64_t ne3,
            size_t nb1,size_t nb2,size_t nb3,size_t offset)

{
  ggml_tensor *pgVar1;
  int64_t local_28;
  int64_t local_20;
  int64_t local_18;
  int64_t local_10;
  
  local_28 = ne0;
  local_20 = ne1;
  local_18 = ne2;
  local_10 = ne3;
  pgVar1 = ggml_view_impl(ctx,a,4,&local_28,offset);
  pgVar1->nb[1] = nb1;
  pgVar1->nb[2] = nb2;
  pgVar1->nb[3] = nb3;
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_view_4d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int64_t               ne0,
        int64_t               ne1,
        int64_t               ne2,
        int64_t               ne3,
        size_t                nb1,
        size_t                nb2,
        size_t                nb3,
        size_t                offset) {
    const int64_t ne[4] = { ne0, ne1, ne2, ne3 };

    struct ggml_tensor * result = ggml_view_impl(ctx, a, 4, ne, offset);

    result->nb[1] = nb1;
    result->nb[2] = nb2;
    result->nb[3] = nb3;

    return result;
}